

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_of_suite.cpp
# Opt level: O0

void all_integer(void)

{
  bool bVar1;
  iterator local_e8;
  iterator local_d0;
  undefined1 local_b8 [8];
  variable data_1;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_38,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_50,&local_78);
  boost::detail::test_impl
            ("!std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x2e,"void all_integer()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_b8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d0,(basic_variable<std::allocator<char>_> *)local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_e8,(basic_variable<std::allocator<char>_> *)local_b8);
  bVar1 = std::all_of<trial::dynamic::basic_variable<std::allocator<char>>::iterator,__0>
                    (&local_d0,&local_e8);
  boost::detail::test_impl
            ("std::all_of(data.begin(), data.end(), is_true)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/all_of_suite.cpp"
             ,0x32,"void all_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  return;
}

Assistant:

void all_integer()
{
    {
        variable data(0);
        TRIAL_PROTOCOL_TEST(!std::all_of(data.begin(), data.end(), is_true));
    }
    {
        variable data(2);
        TRIAL_PROTOCOL_TEST(std::all_of(data.begin(), data.end(), is_true));
    }
}